

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-expr-visitor.h
# Opt level: O0

void __thiscall
mp::BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
          (BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *this,Expr e)

{
  Kind KVar1;
  AssertionFailure *this_00;
  ExprBase gmock_a1;
  MockVisitor *in_RDI;
  ExprBase in_stack_fffffffffffff918;
  BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *in_stack_fffffffffffff938;
  ExprBase in_stack_fffffffffffff940;
  
  KVar1 = internal::ExprBase::kind((ExprBase *)0x14c271);
  gmock_a1.impl_._4_4_ = 0;
  gmock_a1.impl_._0_4_ = KVar1 - FIRST_EXPR;
  switch(gmock_a1.impl_) {
  case (Impl *)0x0:
    internal::ExprTypes::UncheckedCast<mp::NumericConstant>((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitNumericConstant(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x1:
    internal::ExprTypes::UncheckedCast<mp::Reference>((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitVariable(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x2:
    internal::ExprTypes::UncheckedCast<mp::Reference>((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitCommonExpr(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x3:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitMinus(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x4:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitAbs(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x5:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitFloor(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x6:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitCeil(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x7:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitSqrt(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x8:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitPow2(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x9:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitExp(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0xa:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitLog(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0xb:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitLog10(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0xc:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitSin(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0xd:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitSinh(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0xe:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitCos(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0xf:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitCosh(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x10:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitTan(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x11:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitTanh(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x12:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitAsin(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x13:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitAsinh(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x14:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitAcos(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x15:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitAcosh(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x16:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitAtan(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x17:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitAtanh(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x18:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitAdd(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x19:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitSub(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x1a:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitLess(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x1b:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitMul(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x1c:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitDiv(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x1d:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitTruncDiv(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x1e:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitMod(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x1f:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitPow(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x20:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitPowConstBase(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x21:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitPowConstExp(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x22:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitAtan2(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x23:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitPrecision(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x24:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitRound(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x25:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitTrunc(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x26:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitIf(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x27:
    internal::ExprTypes::UncheckedCast<mp::PLTerm>((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitPLTerm(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x28:
    internal::ExprTypes::UncheckedCast<mp::CallExpr>((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitCall(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x29:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitMin(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x2a:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitMax(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x2b:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitSum(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x2c:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitNumberOf(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x2d:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)46,(mp::expr::Kind)46>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    VisitNumberOfSym(in_stack_fffffffffffff938,(SymbolicNumberOfExpr)in_stack_fffffffffffff940.impl_
                    );
    break;
  case (Impl *)0x2e:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitCount(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x2f:
    internal::ExprTypes::UncheckedCast<mp::LogicalConstant>((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitLogicalConstant(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x30:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)49,(mp::expr::Kind)49>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitNot(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x31:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitOr(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x32:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitAnd(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x33:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitIff(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x34:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitLT(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x35:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitLE(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x36:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitEQ(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x37:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitGE(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x38:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitGT(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x39:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitNE(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x3a:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitAtLeast(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x3b:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitAtMost(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x3c:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitExactly(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x3d:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitNotAtLeast(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x3e:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitNotAtMost(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x3f:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitNotExactly(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x40:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitImplication(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x41:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitExists(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x42:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitForAll(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x43:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitAllDiff(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x44:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitNotAllDiff(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x45:
    internal::ExprTypes::UncheckedCast<mp::StringLiteral>((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitStringLiteral(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  case (Impl *)0x46:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)71>>
              ((Expr)in_stack_fffffffffffff918.impl_);
    MockVisitor::VisitSymbolicIf(in_RDI,(Argument1)gmock_a1.impl_);
    break;
  default:
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,(char *)in_stack_fffffffffffff918.impl_);
    __cxa_throw(this_00,&AssertionFailure::typeinfo,AssertionFailure::~AssertionFailure);
  }
  return;
}

Assistant:

Result BasicExprVisitor<Impl, Result, ET>::Visit(Expr e) {
  // All expressions except OPNUMBEROFs and OPIFSYM are supported.
  switch (e.kind()) {
  default:
    MP_ASSERT(false, "invalid expression");
    // Fall through.
  case expr::NUMBER:
    return MP_DISPATCH(VisitNumericConstant(
                         ET::template UncheckedCast<NumericConstant>(e)));
  case expr::VARIABLE:
    return MP_DISPATCH(VisitVariable(ET::template UncheckedCast<Variable>(e)));
  case expr::COMMON_EXPR:
    return MP_DISPATCH(VisitCommonExpr(
                         ET::template UncheckedCast<CommonExpr>(e)));

  // Unary expressions.
  case expr::MINUS:
    return MP_DISPATCH(VisitMinus(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ABS:
    return MP_DISPATCH(VisitAbs(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::FLOOR:
    return MP_DISPATCH(VisitFloor(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::CEIL:
    return MP_DISPATCH(VisitCeil(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::SQRT:
    return MP_DISPATCH(VisitSqrt(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::POW2:
    return MP_DISPATCH(VisitPow2(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::EXP:
    return MP_DISPATCH(VisitExp(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::LOG:
    return MP_DISPATCH(VisitLog(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::LOG10:
    return MP_DISPATCH(VisitLog10(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::SIN:
    return MP_DISPATCH(VisitSin(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::SINH:
    return MP_DISPATCH(VisitSinh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::COS:
    return MP_DISPATCH(VisitCos(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::COSH:
    return MP_DISPATCH(VisitCosh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::TAN:
    return MP_DISPATCH(VisitTan(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::TANH:
    return MP_DISPATCH(VisitTanh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ASIN:
    return MP_DISPATCH(VisitAsin(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ASINH:
    return MP_DISPATCH(VisitAsinh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ACOS:
    return MP_DISPATCH(VisitAcos(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ACOSH:
    return MP_DISPATCH(VisitAcosh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ATAN:
    return MP_DISPATCH(VisitAtan(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ATANH:
    return MP_DISPATCH(VisitAtanh(ET::template UncheckedCast<UnaryExpr>(e)));

  // Binary expressions.
  case expr::ADD:
    return MP_DISPATCH(VisitAdd(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::SUB:
    return MP_DISPATCH(VisitSub(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::LESS:
    return MP_DISPATCH(VisitLess(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::MUL:
    return MP_DISPATCH(VisitMul(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::DIV:
    return MP_DISPATCH(VisitDiv(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::TRUNC_DIV:
    return MP_DISPATCH(VisitTruncDiv(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::MOD:
    return MP_DISPATCH(VisitMod(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::POW:
    return MP_DISPATCH(VisitPow(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::POW_CONST_BASE:
    return MP_DISPATCH(VisitPowConstBase(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::POW_CONST_EXP:
    return MP_DISPATCH(VisitPowConstExp(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::ATAN2:
    return MP_DISPATCH(VisitAtan2(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::PRECISION:
    return MP_DISPATCH(VisitPrecision(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::ROUND:
    return MP_DISPATCH(VisitRound(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::TRUNC:
    return MP_DISPATCH(VisitTrunc(ET::template UncheckedCast<BinaryExpr>(e)));

  case expr::IF:
    return MP_DISPATCH(VisitIf(ET::template UncheckedCast<IfExpr>(e)));
  case expr::PLTERM:
    return MP_DISPATCH(VisitPLTerm(ET::template UncheckedCast<PLTerm>(e)));
  case expr::CALL:
    return MP_DISPATCH(VisitCall(ET::template UncheckedCast<CallExpr>(e)));
  case expr::MIN:
    return MP_DISPATCH(VisitMin(ET::template UncheckedCast<VarArgExpr>(e)));
  case expr::MAX:
    return MP_DISPATCH(VisitMax(ET::template UncheckedCast<VarArgExpr>(e)));
  case expr::SUM:
    return MP_DISPATCH(VisitSum(ET::template UncheckedCast<SumExpr>(e)));
  case expr::NUMBEROF:
    return MP_DISPATCH(VisitNumberOf(
                         ET::template UncheckedCast<NumberOfExpr>(e)));
  case expr::NUMBEROF_SYM:
    return MP_DISPATCH(VisitNumberOfSym(
                         ET::template UncheckedCast<SymbolicNumberOfExpr>(e)));
  case expr::COUNT:
    return MP_DISPATCH(VisitCount(ET::template UncheckedCast<CountExpr>(e)));

    // Logical expressions.
  case expr::BOOL:
    return MP_DISPATCH(VisitLogicalConstant(
                         ET::template UncheckedCast<LogicalConstant>(e)));
  case expr::NOT:
    return MP_DISPATCH(VisitNot(ET::template UncheckedCast<NotExpr>(e)));
  case expr::OR:
    return MP_DISPATCH(VisitOr(
                         ET::template UncheckedCast<BinaryLogicalExpr>(e)));
  case expr::AND:
    return MP_DISPATCH(VisitAnd(
                         ET::template UncheckedCast<BinaryLogicalExpr>(e)));
  case expr::IFF:
    return MP_DISPATCH(VisitIff(
                         ET::template UncheckedCast<BinaryLogicalExpr>(e)));
  case expr::LT:
    return MP_DISPATCH(VisitLT(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::LE:
    return MP_DISPATCH(VisitLE(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::EQ:
    return MP_DISPATCH(VisitEQ(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::GE:
    return MP_DISPATCH(VisitGE(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::GT:
    return MP_DISPATCH(VisitGT(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::NE:
    return MP_DISPATCH(VisitNE(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::ATLEAST:
    return MP_DISPATCH(VisitAtLeast(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::ATMOST:
    return MP_DISPATCH(VisitAtMost(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::EXACTLY:
    return MP_DISPATCH(VisitExactly(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::NOT_ATLEAST:
    return MP_DISPATCH(VisitNotAtLeast(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::NOT_ATMOST:
    return MP_DISPATCH(VisitNotAtMost(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::NOT_EXACTLY:
    return MP_DISPATCH(VisitNotExactly(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::IMPLICATION:
    return MP_DISPATCH(VisitImplication(
                         ET::template UncheckedCast<ImplicationExpr>(e)));
  case expr::EXISTS:
    return MP_DISPATCH(VisitExists(
                         ET::template UncheckedCast<IteratedLogicalExpr>(e)));
  case expr::FORALL:
    return MP_DISPATCH(VisitForAll(
                         ET::template UncheckedCast<IteratedLogicalExpr>(e)));
  case expr::ALLDIFF:
    return MP_DISPATCH(VisitAllDiff(
                         ET::template UncheckedCast<PairwiseExpr>(e)));
  case expr::NOT_ALLDIFF:
    return MP_DISPATCH(VisitNotAllDiff(
                         ET::template UncheckedCast<PairwiseExpr>(e)));

    // String expressions.
  case expr::STRING:
    return MP_DISPATCH(VisitStringLiteral(
                         ET::template UncheckedCast<StringLiteral>(e)));
  case expr::IFSYM:
    return MP_DISPATCH(VisitSymbolicIf(
                         ET::template UncheckedCast<SymbolicIfExpr>(e)));
  }
}